

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

bool __thiscall
binlog::PrettyPrinter::printStruct
          (PrettyPrinter *this,OstreamBuffer *out,StructBegin sb,Range *input)

{
  string_view str;
  string_view x;
  string_view x_00;
  string_view x_01;
  string_view x_02;
  string_view x_03;
  string_view x_04;
  string_view x_05;
  string_view y;
  string_view y_00;
  string_view y_01;
  string_view y_02;
  string_view y_03;
  string_view y_04;
  string_view y_05;
  string_view y_06;
  string_view y_07;
  string_view y_08;
  string_view y_09;
  string_view y_10;
  string_view x_06;
  string_view x_07;
  string_view x_08;
  string_view x_09;
  string_view x_10;
  string_view x_11;
  string_view x_12;
  string_view x_13;
  string_view x_14;
  string_view x_15;
  string_view x_16;
  string_view x_17;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  size_t __n;
  OstreamBuffer *in_RSI;
  long in_RDI;
  uint32_t size;
  int32_t count_1;
  int64_t count;
  char *suffix;
  nanoseconds sinceEpochTz;
  nanoseconds sinceEpoch;
  BrokenDownTime bdt;
  IntegerToHex tohex;
  uint64_t value;
  char *in_stack_fffffffffffffcc8;
  uint6 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  char *in_stack_fffffffffffffcd8;
  OstreamBuffer *in_stack_fffffffffffffce0;
  BrokenDownTime *in_stack_fffffffffffffce8;
  nanoseconds in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  BrokenDownTime *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar5;
  uint in_stack_fffffffffffffd0c;
  PrettyPrinter *in_stack_fffffffffffffd10;
  bool local_2d5;
  size_t local_2c8;
  undefined8 local_2a8;
  undefined8 local_288;
  undefined8 local_248;
  duration<long,std::ratio<1l,1l>> local_138 [8];
  rep local_130;
  long local_128;
  duration<long,std::ratio<1l,1000000000l>> local_120 [8];
  undefined1 local_118 [128];
  string_view local_98;
  IntegerToHex local_88;
  unsigned_long local_68;
  OstreamBuffer *local_18;
  
  local_18 = in_RSI;
  mserialize::string_view::string_view
            ((string_view *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
             in_stack_fffffffffffffcc8);
  x_06._len._0_4_ = in_stack_fffffffffffffd08;
  x_06._ptr = (char *)in_stack_fffffffffffffd00;
  x_06._len._4_4_ = in_stack_fffffffffffffd0c;
  y._len._0_4_ = in_stack_fffffffffffffcf8;
  y._ptr = (char *)in_stack_fffffffffffffcf0.__r;
  y._len._4_4_ = in_stack_fffffffffffffcfc;
  bVar1 = mserialize::operator==(x_06,y);
  local_2d5 = false;
  if (bVar1) {
    mserialize::string_view::string_view
              ((string_view *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
               in_stack_fffffffffffffcc8);
    x_07._len._0_4_ = in_stack_fffffffffffffd08;
    x_07._ptr = (char *)in_stack_fffffffffffffd00;
    x_07._len._4_4_ = in_stack_fffffffffffffd0c;
    y_00._len._0_4_ = in_stack_fffffffffffffcf8;
    y_00._ptr = (char *)in_stack_fffffffffffffcf0.__r;
    y_00._len._4_4_ = in_stack_fffffffffffffcfc;
    local_2d5 = mserialize::operator==(x_07,y_00);
  }
  if (local_2d5 != false) {
    local_68 = Range::read<unsigned_long>
                         ((Range *)CONCAT17(in_stack_fffffffffffffcd7,
                                            CONCAT16(in_stack_fffffffffffffcd6,
                                                     in_stack_fffffffffffffcd0)));
    mserialize::detail::IntegerToHex::IntegerToHex(&local_88);
    mserialize::detail::IntegerToHex::visit<unsigned_long>
              ((IntegerToHex *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
               (unsigned_long)in_stack_fffffffffffffcc8);
    detail::OstreamBuffer::operator<<(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    local_98 = mserialize::detail::IntegerToHex::value((IntegerToHex *)0x1132ec);
    str._len = (size_t)in_stack_fffffffffffffce0;
    str._ptr = in_stack_fffffffffffffcd8;
    detail::OstreamBuffer::operator<<
              ((OstreamBuffer *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),str);
    return true;
  }
  mserialize::string_view::string_view
            ((string_view *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
             in_stack_fffffffffffffcc8);
  x_08._len._0_4_ = in_stack_fffffffffffffd08;
  x_08._ptr = (char *)in_stack_fffffffffffffd00;
  x_08._len._4_4_ = in_stack_fffffffffffffd0c;
  y_01._len._0_4_ = in_stack_fffffffffffffcf8;
  y_01._ptr = (char *)in_stack_fffffffffffffcf0.__r;
  y_01._len._4_4_ = in_stack_fffffffffffffcfc;
  bVar1 = mserialize::operator==(x_08,y_01);
  in_stack_fffffffffffffd0c = in_stack_fffffffffffffd0c & 0xffffff;
  if (bVar1) {
    mserialize::string_view::string_view
              ((string_view *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
               in_stack_fffffffffffffcc8);
    x_09._len._0_4_ = in_stack_fffffffffffffd08;
    x_09._ptr = (char *)in_stack_fffffffffffffd00;
    x_09._len._4_4_ = in_stack_fffffffffffffd0c;
    y_02._len._0_4_ = in_stack_fffffffffffffcf8;
    y_02._ptr = (char *)in_stack_fffffffffffffcf0.__r;
    y_02._len._4_4_ = in_stack_fffffffffffffcfc;
    bVar1 = mserialize::operator==(x_09,y_02);
    in_stack_fffffffffffffd0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd0c);
  }
  if ((char)(in_stack_fffffffffffffd0c >> 0x18) != '\0') {
    if (*(long *)(in_RDI + 0x48) != 0) {
      memset(local_118,0,0x40);
      local_128 = Range::read<long>((Range *)CONCAT17(in_stack_fffffffffffffcd7,
                                                      CONCAT16(in_stack_fffffffffffffcd6,
                                                               in_stack_fffffffffffffcd0)));
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
                (local_120,&local_128);
      if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
        nsSinceEpochToBrokenDownTimeUTC(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        printTime(in_stack_fffffffffffffd10,
                  (OstreamBuffer *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                  in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                  (char *)in_stack_fffffffffffffcf0.__r);
      }
      else {
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  (local_138,(int *)(*(long *)(in_RDI + 0x48) + 0x18));
        local_130 = (rep)std::chrono::operator+
                                   ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                    in_stack_fffffffffffffce8,
                                    (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffce0
                                   );
        nsSinceEpochToBrokenDownTimeUTC(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        uVar5 = *(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x18);
        std::__cxx11::string::data();
        printTime(in_stack_fffffffffffffd10,
                  (OstreamBuffer *)CONCAT44(in_stack_fffffffffffffd0c,uVar5),
                  (BrokenDownTime *)local_18,in_stack_fffffffffffffcfc,
                  (char *)in_stack_fffffffffffffcf0.__r);
      }
      return true;
    }
    return false;
  }
  mserialize::string_view::string_view
            ((string_view *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
             in_stack_fffffffffffffcc8);
  x._len = (size_t)in_stack_fffffffffffffce0;
  x._ptr = in_stack_fffffffffffffcd8;
  bVar1 = mserialize::string_view::starts_with
                    ((string_view *)
                     CONCAT17(in_stack_fffffffffffffcd7,
                              CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),x);
  if (bVar1) {
    mserialize::string_view::string_view
              ((string_view *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
               in_stack_fffffffffffffcc8);
    x_00._len = (size_t)in_stack_fffffffffffffce0;
    x_00._ptr = in_stack_fffffffffffffcd8;
    bVar1 = mserialize::string_view::ends_with
                      ((string_view *)
                       CONCAT17(in_stack_fffffffffffffcd7,
                                CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),x_00)
    ;
    if (bVar1) {
      in_stack_fffffffffffffcf8 = 0x11b7ae;
    }
    else {
      mserialize::string_view::string_view
                ((string_view *)
                 CONCAT17(in_stack_fffffffffffffcd7,
                          CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                 in_stack_fffffffffffffcc8);
      x_01._len = (size_t)in_stack_fffffffffffffce0;
      x_01._ptr = in_stack_fffffffffffffcd8;
      bVar1 = mserialize::string_view::ends_with
                        ((string_view *)
                         CONCAT17(in_stack_fffffffffffffcd7,
                                  CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                         x_01);
      if (bVar1) {
        in_stack_fffffffffffffcf0.__r = (rep)"us";
      }
      else {
        mserialize::string_view::string_view
                  ((string_view *)
                   CONCAT17(in_stack_fffffffffffffcd7,
                            CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                   in_stack_fffffffffffffcc8);
        x_02._len = (size_t)in_stack_fffffffffffffce0;
        x_02._ptr = in_stack_fffffffffffffcd8;
        bVar1 = mserialize::string_view::ends_with
                          ((string_view *)
                           CONCAT17(in_stack_fffffffffffffcd7,
                                    CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                           x_02);
        if (bVar1) {
          in_stack_fffffffffffffcf0.__r = (rep)"ms";
        }
        else {
          mserialize::string_view::string_view
                    ((string_view *)
                     CONCAT17(in_stack_fffffffffffffcd7,
                              CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                     in_stack_fffffffffffffcc8);
          x_03._len = (size_t)in_stack_fffffffffffffce0;
          x_03._ptr = in_stack_fffffffffffffcd8;
          bVar1 = mserialize::string_view::ends_with
                            ((string_view *)
                             CONCAT17(in_stack_fffffffffffffcd7,
                                      CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0))
                             ,x_03);
          if (bVar1) {
            in_stack_fffffffffffffce0 = (OstreamBuffer *)0x11b7cd;
            in_stack_fffffffffffffcf0.__r = (rep)(OstreamBuffer *)0x11b7cd;
          }
          else {
            mserialize::string_view::string_view
                      ((string_view *)
                       CONCAT17(in_stack_fffffffffffffcd7,
                                CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                       in_stack_fffffffffffffcc8);
            x_04._len = (size_t)in_stack_fffffffffffffce0;
            x_04._ptr = in_stack_fffffffffffffcd8;
            bVar1 = mserialize::string_view::ends_with
                              ((string_view *)
                               CONCAT17(in_stack_fffffffffffffcd7,
                                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0
                                                )),x_04);
            if (bVar1) {
              in_stack_fffffffffffffcd8 = "m";
              in_stack_fffffffffffffce0 = (OstreamBuffer *)in_stack_fffffffffffffcd8;
              in_stack_fffffffffffffcf0.__r = (rep)in_stack_fffffffffffffcd8;
            }
            else {
              mserialize::string_view::string_view
                        ((string_view *)
                         CONCAT17(in_stack_fffffffffffffcd7,
                                  CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                         in_stack_fffffffffffffcc8);
              x_05._len = (size_t)in_stack_fffffffffffffce0;
              x_05._ptr = in_stack_fffffffffffffcd8;
              bVar1 = mserialize::string_view::ends_with
                                ((string_view *)
                                 CONCAT17(in_stack_fffffffffffffcd7,
                                          CONCAT16(in_stack_fffffffffffffcd6,
                                                   in_stack_fffffffffffffcd0)),x_05);
              in_stack_fffffffffffffcd8 = (char *)0x0;
              in_stack_fffffffffffffce0 = (OstreamBuffer *)in_stack_fffffffffffffcd8;
              in_stack_fffffffffffffcf0.__r = (rep)in_stack_fffffffffffffcd8;
              if (bVar1) {
                in_stack_fffffffffffffcd8 = "h";
                in_stack_fffffffffffffce0 = (OstreamBuffer *)in_stack_fffffffffffffcd8;
                in_stack_fffffffffffffcf0.__r = (rep)in_stack_fffffffffffffcd8;
              }
            }
          }
        }
      }
      in_stack_fffffffffffffcf8 = (int)in_stack_fffffffffffffcf0.__r;
    }
    in_stack_fffffffffffffcfc = 0;
    if (in_stack_fffffffffffffcf8 != 0) {
      mserialize::string_view::string_view
                ((string_view *)
                 CONCAT17(in_stack_fffffffffffffcd7,
                          CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                 in_stack_fffffffffffffcc8);
      x_10._len._0_4_ = in_stack_fffffffffffffd08;
      x_10._ptr = (char *)in_stack_fffffffffffffd00;
      x_10._len._4_4_ = in_stack_fffffffffffffd0c;
      y_03._len._0_4_ = in_stack_fffffffffffffcf8;
      y_03._ptr = (char *)in_stack_fffffffffffffcf0.__r;
      y_03._len._4_4_ = in_stack_fffffffffffffcfc;
      bVar1 = mserialize::operator==(x_10,y_03);
      if (bVar1) {
        Range::read<long>((Range *)CONCAT17(in_stack_fffffffffffffcd7,
                                            CONCAT16(in_stack_fffffffffffffcd6,
                                                     in_stack_fffffffffffffcd0)));
        detail::OstreamBuffer::operator<<
                  ((OstreamBuffer *)
                   CONCAT17(in_stack_fffffffffffffcd7,
                            CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                   (int64_t)in_stack_fffffffffffffcc8);
        detail::OstreamBuffer::operator<<(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        return true;
      }
      mserialize::string_view::string_view
                ((string_view *)
                 CONCAT17(in_stack_fffffffffffffcd7,
                          CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                 in_stack_fffffffffffffcc8);
      x_11._len._0_4_ = in_stack_fffffffffffffd08;
      x_11._ptr = (char *)in_stack_fffffffffffffd00;
      x_11._len._4_4_ = in_stack_fffffffffffffd0c;
      y_04._len._0_4_ = in_stack_fffffffffffffcf8;
      y_04._ptr = (char *)in_stack_fffffffffffffcf0.__r;
      y_04._len._4_4_ = in_stack_fffffffffffffcfc;
      bVar1 = mserialize::operator==(x_11,y_04);
      if (bVar1) {
        Range::read<int>((Range *)CONCAT17(in_stack_fffffffffffffcd7,
                                           CONCAT16(in_stack_fffffffffffffcd6,
                                                    in_stack_fffffffffffffcd0)));
        detail::OstreamBuffer::operator<<
                  ((OstreamBuffer *)
                   CONCAT17(in_stack_fffffffffffffcd7,
                            CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
                   (int32_t)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        detail::OstreamBuffer::operator<<(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        return true;
      }
    }
  }
  mserialize::string_view::string_view
            ((string_view *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
             in_stack_fffffffffffffcc8);
  x_12._len._0_4_ = in_stack_fffffffffffffd08;
  x_12._ptr = (char *)in_stack_fffffffffffffd00;
  x_12._len._4_4_ = in_stack_fffffffffffffd0c;
  y_05._len._0_4_ = in_stack_fffffffffffffcf8;
  y_05._ptr = (char *)in_stack_fffffffffffffcf0.__r;
  y_05._len._4_4_ = in_stack_fffffffffffffcfc;
  bVar1 = mserialize::operator==(x_12,y_05);
  if (bVar1) {
    mserialize::string_view::string_view
              ((string_view *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
               in_stack_fffffffffffffcc8);
    x_13._len._0_4_ = in_stack_fffffffffffffd08;
    x_13._ptr = (char *)in_stack_fffffffffffffd00;
    x_13._len._4_4_ = in_stack_fffffffffffffd0c;
    y_06._len._0_4_ = in_stack_fffffffffffffcf8;
    y_06._ptr = (char *)in_stack_fffffffffffffcf0.__r;
    y_06._len._4_4_ = in_stack_fffffffffffffcfc;
    bVar2 = mserialize::operator==(x_13,y_06);
    in_stack_fffffffffffffcd7 = true;
    __n = CONCAT71((int7)((ulong)local_248 >> 8),bVar2);
    bVar1 = (bool)in_stack_fffffffffffffcd7;
    if (bVar2) goto LAB_00113ae8;
  }
  mserialize::string_view::string_view
            ((string_view *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
             in_stack_fffffffffffffcc8);
  x_14._len._0_4_ = in_stack_fffffffffffffd08;
  x_14._ptr = (char *)in_stack_fffffffffffffd00;
  x_14._len._4_4_ = in_stack_fffffffffffffd0c;
  y_07._len._0_4_ = in_stack_fffffffffffffcf8;
  y_07._ptr = (char *)in_stack_fffffffffffffcf0.__r;
  y_07._len._4_4_ = in_stack_fffffffffffffcfc;
  bVar1 = mserialize::operator==(x_14,y_07);
  if (bVar1) {
    mserialize::string_view::string_view
              ((string_view *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
               in_stack_fffffffffffffcc8);
    x_15._len._0_4_ = in_stack_fffffffffffffd08;
    x_15._ptr = (char *)in_stack_fffffffffffffd00;
    x_15._len._4_4_ = in_stack_fffffffffffffd0c;
    y_08._len._0_4_ = in_stack_fffffffffffffcf8;
    y_08._ptr = (char *)in_stack_fffffffffffffcf0.__r;
    y_08._len._4_4_ = in_stack_fffffffffffffcfc;
    bVar2 = mserialize::operator==(x_15,y_08);
    in_stack_fffffffffffffcd7 = true;
    __n = CONCAT71((int7)((ulong)local_288 >> 8),bVar2);
    bVar1 = (bool)in_stack_fffffffffffffcd7;
    if (bVar2) goto LAB_00113ae8;
  }
  mserialize::string_view::string_view
            ((string_view *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)),
             in_stack_fffffffffffffcc8);
  x_16._len._0_4_ = in_stack_fffffffffffffd08;
  x_16._ptr = (char *)in_stack_fffffffffffffd00;
  x_16._len._4_4_ = in_stack_fffffffffffffd0c;
  y_09._len._0_4_ = in_stack_fffffffffffffcf8;
  y_09._ptr = (char *)in_stack_fffffffffffffcf0.__r;
  y_09._len._4_4_ = in_stack_fffffffffffffcfc;
  bVar2 = mserialize::operator==(x_16,y_09);
  __n = CONCAT71((int7)((ulong)local_2a8 >> 8),bVar2);
  in_stack_fffffffffffffcd6 = false;
  bVar1 = (bool)in_stack_fffffffffffffcd6;
  if (bVar2) {
    mserialize::string_view::string_view
              ((string_view *)CONCAT17(in_stack_fffffffffffffcd7,(uint7)in_stack_fffffffffffffcd0),
               in_stack_fffffffffffffcc8);
    x_17._len._0_4_ = in_stack_fffffffffffffd08;
    x_17._ptr = (char *)in_stack_fffffffffffffd00;
    x_17._len._4_4_ = in_stack_fffffffffffffd0c;
    y_10._len._0_4_ = in_stack_fffffffffffffcf8;
    y_10._ptr = (char *)in_stack_fffffffffffffcf0.__r;
    y_10._len._4_4_ = in_stack_fffffffffffffcfc;
    in_stack_fffffffffffffcd6 = mserialize::operator==(x_17,y_10);
    __n = local_2c8;
    bVar1 = (bool)in_stack_fffffffffffffcd6;
  }
LAB_00113ae8:
  if (bVar1 != false) {
    uVar3 = Range::read<unsigned_int>
                      ((Range *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffcd6,
                                                        in_stack_fffffffffffffcd0)));
    pcVar4 = Range::view((Range *)in_stack_fffffffffffffce0,(size_t)in_stack_fffffffffffffcd8);
    detail::OstreamBuffer::write(local_18,(int)pcVar4,(void *)(ulong)uVar3,__n);
  }
  return bVar1 != false;
}

Assistant:

bool PrettyPrinter::printStruct(detail::OstreamBuffer& out, mserialize::Visitor::StructBegin sb, Range& input) const
{
  if (sb.name == "binlog::address" && sb.tag == "`value'L")
  {
    const std::uint64_t value = input.read<std::uint64_t>();
    mserialize::detail::IntegerToHex tohex;
    tohex.visit(value);
    out << "0x" << tohex.value();
    return true;
  }

  if (sb.name == "std::chrono::system_clock::time_point" && sb.tag == "`ns'l")
  {
    if (_clockSync == nullptr) { return false; }

    BrokenDownTime bdt{};
    const auto sinceEpoch = std::chrono::nanoseconds{input.read<std::int64_t>()};

    if (_useLocaltime)
    {
      const std::chrono::nanoseconds sinceEpochTz = sinceEpoch + std::chrono::seconds{_clockSync->tzOffset};
      nsSinceEpochToBrokenDownTimeUTC(sinceEpochTz, bdt);
      printTime(out, bdt, _clockSync->tzOffset, _clockSync->tzName.data());
    }
    else
    {
      nsSinceEpochToBrokenDownTimeUTC(sinceEpoch, bdt);
      printTime(out, bdt, 0, "UTC");
    }
    return true;
  }

  if (sb.name.starts_with("std::chrono::duration<Rep,"))
  {
    const char* suffix =
      sb.name.ends_with("std::nano>") ? "ns" :
      sb.name.ends_with("std::micro>") ? "us" :
      sb.name.ends_with("std::milli>") ? "ms" :
      sb.name.ends_with("std::ratio<1>>") ? "s" :
      sb.name.ends_with("std::ratio<60>>") ? "m" :
      sb.name.ends_with("std::ratio<3600>>") ? "h" :
      nullptr;
    if (suffix != nullptr)
    {
      if (sb.tag == "`count'l")
      {
        const std::int64_t count = input.read<std::int64_t>();
        out << count << suffix;
        return true;
      }
      if (sb.tag == "`count'i") // on MSVC, for minutes and hours
      {
        const std::int32_t count = input.read<std::int32_t>();
        out << count << suffix;
        return true;
      }
    }
  }

  if ((sb.name == "std::filesystem::path" && sb.tag == "`str'[c")
  || (sb.name == "std::filesystem::directory_entry" && sb.tag == "`path'{std::filesystem::path`str'[c}")
  || (sb.name == "std::error_code" && sb.tag == "`message'[c")
  ) {
    const std::uint32_t size = input.read<std::uint32_t>();
    out.write(input.view(size), size);
    return true;
  }

  return false;
}